

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_generate.cpp
# Opt level: O0

compile_errcode __thiscall ConstantDefinition::Generate(ConstantDefinition *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_2c;
  int local_28;
  int character_number;
  int line_number;
  SymbolName name;
  int ret;
  int state;
  ConstantDefinition *this_local;
  
  name = WHILE_SYM;
  line_number = 0;
  _ret = this;
  do {
    character_number = SymbolQueue::GetCurrentName(handle_correct_queue);
    local_28 = SymbolQueue::GetCurrentLine(handle_correct_queue);
    local_2c = SymbolQueue::GetCurrentCharacter(handle_correct_queue);
    switch(name) {
    case WHILE_SYM:
      if (character_number != 0x16) {
        return -1;
      }
      name = SWITCH_SYM;
      break;
    case SWITCH_SYM:
      bVar1 = IsValidVariableType(character_number);
      if (!bVar1) {
        return -0x7d8;
      }
      name = IF_SYM;
      this->m_type = character_number;
      break;
    case IF_SYM:
      if (character_number != 0x22) {
        return -1;
      }
      name = CASE_SYM;
      SymbolQueue::GetCurrentValue<std::__cxx11::string>(&local_50,handle_correct_queue);
      std::__cxx11::string::operator=((string *)&this->m_identifier_name,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar1 = SymbolTableTree::FindTerm(symbol_table_tree,&this->m_identifier_name,true);
      if (bVar1) {
        this->m_valid = false;
      }
      else {
        this->m_valid = true;
      }
      break;
    case CASE_SYM:
      if (character_number != 0xf) {
        return -1;
      }
      name = DEFAULT_SYM;
      break;
    case DEFAULT_SYM:
      if ((character_number != 0x25) && (character_number != 0x20)) {
        return -1;
      }
      name = RETURN_SYM;
      break;
    case RETURN_SYM:
      if (character_number == 0x17) {
        name = IF_SYM;
      }
      else {
        if (character_number != 0x18) {
          return -1;
        }
        name = PRINTF_SYM;
      }
      break;
    case PRINTF_SYM:
      return 0;
    }
    SymbolQueue::NextSymbol(handle_correct_queue);
  } while( true );
}

Assistant:

compile_errcode ConstantDefinition::Generate() {
    int state = 0;
    int ret = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if (name == CONST_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (IsValidVariableType(name)) {
                    state = 2;
                    m_type = name;
                    break;
                } else {
                    return INVALID_TYPE_ERROR;
                }
            }
            case 2: {
                if (name == IDENTIFIER_SYM) {
                    state = 3;
                    m_identifier_name = handle_correct_queue->GetCurrentValue<string>();
                    if (symbol_table_tree->FindTerm(m_identifier_name, true)) {
                        m_valid = false;
                    } else {
                        m_valid = true;
                    }
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == ASSIGN_SYM) {
                    state = 4;
                } else {
                    return NOT_MATCH;
                }
                break;
            }
            case 4: {
                if (name == INTERGER_SYM || name == CHARACTER_SYM) {
                    state = 5;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 5: {
                if (name == COMMA_SYM) {
                    state = 2;
                } else if (name == SEMICOLON_SYM) {
                    state = 6;
                } else {
                   return NOT_MATCH;
                }
                break;
            }
            case 6: return COMPILE_OK;
        }
        handle_correct_queue->NextSymbol();
    }
}